

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

void greatest_get_report(greatest_report_t *report)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  uVar2 = greatest_info._16_8_;
  if (report != (greatest_report_t *)0x0) {
    uVar1 = greatest_info.failed;
    report->passed = greatest_info.passed;
    uVar3 = greatest_info._16_8_;
    report->failed = uVar1;
    greatest_info.skipped = (uint)uVar2;
    greatest_info.assertions = SUB84(uVar2,4);
    uVar1 = greatest_info.assertions;
    report->skipped = greatest_info.skipped;
    greatest_info._16_8_ = uVar3;
    report->assertions = uVar1;
  }
  return;
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}